

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::replace_path_prefix
               (SmallVectorImpl<char> *Path,StringRef *OldPrefix,StringRef *NewPrefix,Style style)

{
  Style SVar1;
  bool bVar2;
  iterator pcVar3;
  size_t sVar4;
  size_t sVar5;
  Twine local_238;
  Twine local_220;
  Twine local_208;
  Twine local_1f0;
  Twine local_1d8;
  Twine local_1c0;
  Twine local_1a8;
  Twine local_180;
  undefined1 local_168 [8];
  SmallString<256U> NewPath;
  StringRef RelPath;
  undefined1 local_38 [8];
  StringRef OrigPath;
  Style style_local;
  StringRef *NewPrefix_local;
  StringRef *OldPrefix_local;
  SmallVectorImpl<char> *Path_local;
  
  OrigPath.Length._4_4_ = style;
  bVar2 = StringRef::empty(OldPrefix);
  if ((!bVar2) || (bVar2 = StringRef::empty(NewPrefix), !bVar2)) {
    pcVar3 = SmallVectorTemplateCommon<char,_void>::begin
                       ((SmallVectorTemplateCommon<char,_void> *)Path);
    sVar4 = SmallVectorBase::size((SmallVectorBase *)Path);
    StringRef::StringRef((StringRef *)local_38,pcVar3,sVar4);
    bVar2 = StringRef::startswith((StringRef *)local_38,*OldPrefix);
    if (bVar2) {
      sVar4 = StringRef::size(OldPrefix);
      sVar5 = StringRef::size(NewPrefix);
      if (sVar4 == sVar5) {
        pcVar3 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)Path);
        copy<llvm::StringRef_const&,char*>(NewPrefix,pcVar3);
      }
      else {
        sVar4 = StringRef::size(OldPrefix);
        join_0x00000010_0x00000000_ =
             StringRef::substr((StringRef *)local_38,sVar4,0xffffffffffffffff);
        SmallString<256U>::SmallString((SmallString<256U> *)local_168);
        SVar1 = OrigPath.Length._4_4_;
        Twine::Twine(&local_180,NewPrefix);
        Twine::Twine(&local_1a8,"");
        Twine::Twine(&local_1c0,"");
        Twine::Twine(&local_1d8,"");
        append((SmallVectorImpl<char> *)local_168,SVar1,&local_180,&local_1a8,&local_1c0,&local_1d8)
        ;
        SVar1 = OrigPath.Length._4_4_;
        Twine::Twine(&local_1f0,
                     (StringRef *)
                     (NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                      InlineElts + 0xf8));
        Twine::Twine(&local_208,"");
        Twine::Twine(&local_220,"");
        Twine::Twine(&local_238,"");
        append((SmallVectorImpl<char> *)local_168,SVar1,&local_1f0,&local_208,&local_220,&local_238)
        ;
        SmallVectorImpl<char>::swap(Path,(SmallVectorImpl<char> *)local_168);
        SmallString<256U>::~SmallString((SmallString<256U> *)local_168);
      }
    }
  }
  return;
}

Assistant:

void replace_path_prefix(SmallVectorImpl<char> &Path,
                         const StringRef &OldPrefix, const StringRef &NewPrefix,
                         Style style) {
  if (OldPrefix.empty() && NewPrefix.empty())
    return;

  StringRef OrigPath(Path.begin(), Path.size());
  if (!OrigPath.startswith(OldPrefix))
    return;

  // If prefixes have the same size we can simply copy the new one over.
  if (OldPrefix.size() == NewPrefix.size()) {
    llvm::copy(NewPrefix, Path.begin());
    return;
  }

  StringRef RelPath = OrigPath.substr(OldPrefix.size());
  SmallString<256> NewPath;
  path::append(NewPath, style, NewPrefix);
  path::append(NewPath, style, RelPath);
  Path.swap(NewPath);
}